

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestNetwork::TestNetwork(TestNetwork *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->dumper).schemas._M_t._M_impl.super__Rb_tree_header;
  (this->dumper).schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dumper).schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dumper).schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dumper).schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dumper).schemas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->dumper).returnTypes._M_t._M_impl.super__Rb_tree_header;
  (this->dumper).returnTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dumper).returnTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->dumper).returnTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->dumper).returnTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->dumper).returnTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)0x666508);
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)0x666888);
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)0x666b98);
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)0x667008);
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)0x667188);
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)0x667308);
  RpcDumper::addSchema(&this->dumper,(InterfaceSchema)0x667550);
  return;
}

Assistant:

TestNetwork() {
    dumper.addSchema(Schema::from<test::TestInterface>());
    dumper.addSchema(Schema::from<test::TestExtends>());
    dumper.addSchema(Schema::from<test::TestPipeline>());
    dumper.addSchema(Schema::from<test::TestCallOrder>());
    dumper.addSchema(Schema::from<test::TestTailCallee>());
    dumper.addSchema(Schema::from<test::TestTailCaller>());
    dumper.addSchema(Schema::from<test::TestMoreStuff>());
  }